

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O1

Error * __thiscall
ot::commissioner::CommissionerApp::SetChannel
          (Error *__return_storage_ptr__,CommissionerApp *this,Channel *aChannel,MilliSeconds aDelay
          )

{
  ErrorCode EVar1;
  int iVar2;
  char *pcVar3;
  char *begin;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  PendingOperationalDataset pendingDataset;
  string local_188;
  undefined1 local_168 [8];
  char *local_160;
  size_t local_158;
  char local_150 [8];
  format_string_checker<char> *local_148;
  parse_func local_140 [1];
  ErrorCode local_138;
  undefined1 *local_130 [2];
  undefined1 local_120 [16];
  PendingOperationalDataset local_110;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  PendingOperationalDataset::PendingOperationalDataset(&local_110);
  iVar2 = (*(this->super_CommissionerHandler)._vptr_CommissionerHandler[0xf])(this);
  if ((char)iVar2 == '\0') {
    local_168._0_4_ = none_type;
    local_160 = "the commissioner is not active";
    local_158 = 0x1e;
    local_150 = (char  [8])0x0;
    local_140[0] = (parse_func)0x0;
    begin = "the commissioner is not active";
    local_148 = (format_string_checker<char> *)local_168;
    do {
      pcVar3 = begin + 1;
      if (*begin == '}') {
        if ((pcVar3 == "") || (*pcVar3 != '}')) {
          fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar3 = begin + 2;
      }
      else if (*begin == '{') {
        pcVar3 = fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (begin,"",(format_string_checker<char> *)local_168);
      }
      begin = pcVar3;
    } while (pcVar3 != "");
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_168;
    fmt::v10::vformat_abi_cxx11_(&local_188,(v10 *)0x233cbc,(string_view)ZEXT816(0x1e),args);
    local_138 = kInvalidState;
    local_130[0] = local_120;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_130,local_188._M_dataplus._M_p,
               local_188._M_dataplus._M_p + local_188._M_string_length);
    __return_storage_ptr__->mCode = local_138;
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)local_130)
    ;
    if (local_130[0] != local_120) {
      operator_delete(local_130[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p);
    }
  }
  else {
    local_110.super_ActiveOperationalDataset.mChannel = *aChannel;
    local_110.super_ActiveOperationalDataset._212_4_ = SUB84(aDelay.__r,0);
    local_110.super_ActiveOperationalDataset.mPresentFlags =
         local_110.super_ActiveOperationalDataset.mPresentFlags | 0x4020;
    (*((this->mCommissioner).
       super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_Commissioner[0x22])(local_168);
    __return_storage_ptr__->mCode = local_168._0_4_;
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->mMessage,(string *)&local_160);
    EVar1 = __return_storage_ptr__->mCode;
    if (local_160 != local_150) {
      operator_delete(local_160);
    }
    if (EVar1 == kNone) {
      MergeDataset(&this->mPendingDataset,&local_110);
    }
  }
  if (local_110.super_ActiveOperationalDataset.mSecurityPolicy.mFlags.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110.super_ActiveOperationalDataset.mSecurityPolicy.mFlags.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_110.super_ActiveOperationalDataset.mPSKc.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110.super_ActiveOperationalDataset.mPSKc.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_110.super_ActiveOperationalDataset.mNetworkMasterKey.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110.super_ActiveOperationalDataset.mNetworkMasterKey.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_110.super_ActiveOperationalDataset.mMeshLocalPrefix.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110.super_ActiveOperationalDataset.mMeshLocalPrefix.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>::
  ~vector(&local_110.super_ActiveOperationalDataset.mChannelMask);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.super_ActiveOperationalDataset.mNetworkName._M_dataplus._M_p !=
      &local_110.super_ActiveOperationalDataset.mNetworkName.field_2) {
    operator_delete(local_110.super_ActiveOperationalDataset.mNetworkName._M_dataplus._M_p);
  }
  if (local_110.super_ActiveOperationalDataset.mExtendedPanId.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110.super_ActiveOperationalDataset.mExtendedPanId.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::SetChannel(const Channel &aChannel, MilliSeconds aDelay)
{
    Error                     error;
    PendingOperationalDataset pendingDataset;

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));

    pendingDataset.mChannel = aChannel;
    pendingDataset.mPresentFlags |= PendingOperationalDataset::kChannelBit;

    pendingDataset.mDelayTimer = aDelay.count();
    pendingDataset.mPresentFlags |= PendingOperationalDataset::kDelayTimerBit;

    SuccessOrExit(error = mCommissioner->SetPendingDataset(pendingDataset));

    MergeDataset(mPendingDataset, pendingDataset);

exit:
    return error;
}